

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opl.cpp
# Opt level: O0

void __thiscall DBOPL::WriteReg(DBOPL *this,int idx,int val)

{
  byte bVar1;
  uint uVar2;
  ulong uVar3;
  op_type *op_pt;
  Bitu BVar4;
  ulong uVar5;
  uint uVar6;
  int iVar7;
  Bitu local_1c8;
  ulong local_1c0;
  ulong local_1b8;
  ulong local_1a8;
  ulong local_1a0;
  ulong local_190;
  ulong local_188;
  ulong local_178;
  Bitu local_168;
  ulong local_160;
  Bitu local_158;
  ulong local_150;
  op_type *op_ptr_4;
  Bits wselbase;
  Bitu base_7;
  int num_4;
  Bitu chanbase_4;
  Bits opbase_2;
  Bitu base_6;
  Bitu chanbase_3;
  Bits modbase_1;
  Bits opbase_1;
  Bitu base_5;
  Bitu chanbase_2;
  Bits modbase;
  Bits opbase;
  Bitu base_4;
  op_type *op_ptr_3;
  Bitu regbase_3;
  Bitu base_3;
  int num_3;
  op_type *op_ptr_2;
  Bitu regbase_2;
  Bitu base_2;
  int num_2;
  Bitu regbase_1;
  op_type *op_ptr_1;
  Bitu chanbase_1;
  Bitu modop_1;
  Bitu base_1;
  int num_1;
  op_type *op_ptr;
  Bitu chanbase;
  Bitu regbase;
  Bitu modop;
  Bitu base;
  int num;
  Bit32u second_set;
  int val_local;
  int idx_local;
  DBOPL *this_local;
  
  uVar6 = idx & 0x100;
  num._0_1_ = (byte)val;
  this->adlibreg[idx] = (byte)num;
  uVar2 = idx & 0xf0;
  if (uVar2 == 0) {
    if (1 < idx - 2U) {
      if (idx == 4) {
        if ((val & 0x80U) == 0) {
          this->status = '\0';
        }
        else {
          this->status = this->status & 0x9f;
        }
      }
      else if ((idx != 8) && (idx == 0x104)) {
        this->op[0].is_4op = (val & 1U) != 0;
        this->op[3].is_4op_attached = (bool)(this->op[0].is_4op & 1);
        this->op[1].is_4op = (val & 2U) != 0;
        this->op[4].is_4op_attached = (bool)(this->op[1].is_4op & 1);
        this->op[2].is_4op = (val & 4U) != 0;
        this->op[5].is_4op_attached = (bool)(this->op[2].is_4op & 1);
        this->op[0x12].is_4op = (val & 8U) != 0;
        this->op[0x15].is_4op_attached = (bool)(this->op[0x12].is_4op & 1);
        this->op[0x13].is_4op = (val & 0x10U) != 0;
        this->op[0x16].is_4op_attached = (bool)(this->op[0x13].is_4op & 1);
        this->op[0x14].is_4op = (val & 0x20U) != 0;
        this->op[0x17].is_4op_attached = (bool)(this->op[0x14].is_4op & 1);
      }
    }
  }
  else if ((uVar2 == 0x20) || (uVar2 == 0x30)) {
    uVar5 = (ulong)(int)(idx - 0x20U & 0xff);
    if (((idx & 7U) < 6) && (uVar5 < 0x16)) {
      local_150 = uVar5;
      if (uVar6 != 0) {
        local_150 = uVar5 + 0x16;
      }
      uVar3 = (ulong)""[local_150];
      BVar4 = uVar5 + uVar6;
      local_158 = uVar3;
      if (uVar6 != 0) {
        local_158 = uVar3 + 0xee;
      }
      iVar7 = 9;
      if ((idx & 7U) < 3) {
        iVar7 = 0;
      }
      op_pt = this->op + uVar3 + (long)iVar7;
      change_keepsustain(this,BVar4,op_pt);
      change_vibrato(this,BVar4,op_pt);
      if (((this->adlibreg[0x105] & 1) == 0) || ((this->op[uVar3].is_4op_attached & 1U) == 0)) {
        change_frequency(this,local_158,BVar4,op_pt);
      }
      else {
        change_frequency(this,local_158 - 3,BVar4,op_pt);
      }
    }
  }
  else if ((uVar2 == 0x40) || (uVar2 == 0x50)) {
    uVar5 = (ulong)(int)(idx - 0x40U & 0xff);
    if (((idx & 7U) < 6) && (uVar5 < 0x16)) {
      local_160 = uVar5;
      if (uVar6 != 0) {
        local_160 = uVar5 + 0x16;
      }
      uVar3 = (ulong)""[local_160];
      local_168 = uVar3;
      if (uVar6 != 0) {
        local_168 = uVar3 + 0xee;
      }
      iVar7 = 9;
      if ((idx & 7U) < 3) {
        iVar7 = 0;
      }
      if (((this->adlibreg[0x105] & 1) == 0) || ((this->op[uVar3].is_4op_attached & 1U) == 0)) {
        change_frequency(this,local_168,uVar5 + uVar6,this->op + uVar3 + (long)iVar7);
      }
      else {
        change_frequency(this,local_168 - 3,uVar5 + uVar6,this->op + uVar3 + (long)iVar7);
      }
    }
  }
  else if ((uVar2 == 0x60) || (uVar2 == 0x70)) {
    local_178 = (ulong)(int)(idx - 0x60U & 0xff);
    if (((idx & 7U) < 6) && (local_178 < 0x16)) {
      BVar4 = local_178 + uVar6;
      if (uVar6 != 0) {
        local_178 = local_178 + 0x16;
      }
      bVar1 = ""[local_178];
      change_attackrate(this,BVar4,this->op + bVar1);
      change_decayrate(this,BVar4,this->op + bVar1);
    }
  }
  else if ((uVar2 == 0x80) || (uVar2 == 0x90)) {
    local_188 = (ulong)(int)(idx - 0x80U & 0xff);
    if (((idx & 7U) < 6) && (local_188 < 0x16)) {
      BVar4 = local_188 + uVar6;
      if (uVar6 != 0) {
        local_188 = local_188 + 0x16;
      }
      bVar1 = ""[local_188];
      change_releaserate(this,BVar4,this->op + bVar1);
      change_sustainlevel(this,BVar4,this->op + bVar1);
    }
  }
  else if (uVar2 == 0xa0) {
    local_1a0 = (ulong)(int)(idx - 0xa0U & 0xff);
    if (local_1a0 < 9) {
      local_190 = local_1a0;
      if (uVar6 != 0) {
        local_190 = local_1a0 + 0x12;
      }
      if (((this->adlibreg[0x105] & 1) == 0) || ((this->op[local_190].is_4op_attached & 1U) == 0)) {
        uVar5 = (ulong)(""[local_1a0] + uVar6);
        BVar4 = local_1a0 + uVar6;
        change_frequency(this,BVar4,uVar5,this->op + local_190);
        change_frequency(this,BVar4,uVar5 + 3,this->op + local_190 + 9);
        if ((this->adlibreg[0x105] & 1) != 0) {
          if (uVar6 != 0) {
            local_1a0 = local_1a0 + 0x12;
          }
          if ((this->op[local_1a0].is_4op & 1U) != 0) {
            change_frequency(this,BVar4,uVar5 + 8,this->op + local_190 + 3);
            change_frequency(this,BVar4,uVar5 + 0xb,this->op + local_190 + 0xc);
          }
        }
      }
    }
  }
  else if (uVar2 == 0xb0) {
    if (idx == 0xbd) {
      if (uVar6 == 0) {
        if ((val & 0x30U) == 0x30) {
          enable_operator(this,0x10,this->op + 6,2);
          change_frequency(this,6,0x10,this->op + 6);
          enable_operator(this,0x13,this->op + 0xf,2);
          change_frequency(this,6,0x13,this->op + 0xf);
        }
        else {
          disable_operator(this,this->op + 6,2);
          disable_operator(this,this->op + 0xf,2);
        }
        if ((val & 0x28U) == 0x28) {
          enable_operator(this,0x14,this->op + 0x10,2);
          change_frequency(this,7,0x14,this->op + 0x10);
        }
        else {
          disable_operator(this,this->op + 0x10,2);
        }
        if ((val & 0x24U) == 0x24) {
          enable_operator(this,0x12,this->op + 8,2);
          change_frequency(this,8,0x12,this->op + 8);
        }
        else {
          disable_operator(this,this->op + 8,2);
        }
        if ((val & 0x22U) == 0x22) {
          enable_operator(this,0x15,this->op + 0x11,2);
          change_frequency(this,8,0x15,this->op + 0x11);
        }
        else {
          disable_operator(this,this->op + 0x11,2);
        }
        if ((val & 0x21U) == 0x21) {
          enable_operator(this,0x11,this->op + 7,2);
          change_frequency(this,7,0x11,this->op + 7);
        }
        else {
          disable_operator(this,this->op + 7,2);
        }
      }
    }
    else {
      local_1b8 = (ulong)(int)(idx - 0xb0U & 0xff);
      if (local_1b8 < 9) {
        local_1a8 = local_1b8;
        if (uVar6 != 0) {
          local_1a8 = local_1b8 + 0x12;
        }
        if (((this->adlibreg[0x105] & 1) == 0) || ((this->op[local_1a8].is_4op_attached & 1U) == 0))
        {
          uVar5 = (ulong)(""[local_1b8] + uVar6);
          if ((val & 0x20U) == 0) {
            disable_operator(this,this->op + local_1a8,1);
            disable_operator(this,this->op + local_1a8 + 9,1);
            if (((this->adlibreg[0x105] & 1) != 0) && ((this->op[local_1a8].is_4op & 1U) != 0)) {
              disable_operator(this,this->op + local_1a8 + 3,1);
              disable_operator(this,this->op + local_1a8 + 0xc,1);
            }
          }
          else {
            enable_operator(this,uVar5,this->op + local_1a8,1);
            enable_operator(this,uVar5 + 3,this->op + local_1a8 + 9,1);
            if (((this->adlibreg[0x105] & 1) != 0) && ((this->op[local_1a8].is_4op & 1U) != 0)) {
              enable_operator(this,uVar5 + 8,this->op + local_1a8 + 3,1);
              enable_operator(this,uVar5 + 0xb,this->op + local_1a8 + 0xc,1);
            }
          }
          BVar4 = local_1b8 + uVar6;
          change_frequency(this,BVar4,uVar5,this->op + local_1a8);
          change_frequency(this,BVar4,uVar5 + 3,this->op + local_1a8 + 9);
          if ((this->adlibreg[0x105] & 1) != 0) {
            if (uVar6 != 0) {
              local_1b8 = local_1b8 + 0x12;
            }
            if ((this->op[local_1b8].is_4op & 1U) != 0) {
              change_frequency(this,BVar4,uVar5 + 8,this->op + local_1a8 + 3);
              change_frequency(this,BVar4,uVar5 + 0xb,this->op + local_1a8 + 0xc);
            }
          }
        }
      }
    }
  }
  else if (uVar2 == 0xc0) {
    uVar5 = (ulong)(int)(idx - 0xc0U & 0xff);
    if (uVar5 < 9) {
      local_1c0 = uVar5;
      if (uVar6 != 0) {
        local_1c0 = uVar5 + 0x12;
      }
      change_feedback(this,uVar5 + uVar6,this->op + local_1c0);
      if ((this->FullPan & 1U) == 0) {
        this->op[local_1c0].left_pan = (float)((int)(val & 0x10U) >> 4);
        this->op[local_1c0].right_pan = (float)((int)(val & 0x20U) >> 5);
      }
    }
  }
  else if ((uVar2 == 0xe0) || (uVar2 == 0xf0)) {
    local_1c8 = (Bitu)(int)(idx - 0xe0U & 0xff);
    if (((idx & 7U) < 6) && (local_1c8 < 0x16)) {
      if (uVar6 != 0) {
        local_1c8 = local_1c8 + 0x16;
      }
      if ((this->adlibreg[0x105] & 1) == 0) {
        this->wave_sel[local_1c8] = (byte)num & 3;
      }
      else {
        this->wave_sel[local_1c8] = (byte)num & 7;
      }
      iVar7 = 9;
      if ((idx & 7U) < 3) {
        iVar7 = 0;
      }
      change_waveform(this,local_1c8,this->op + (int)((uint)""[local_1c8] + iVar7));
    }
  }
  return;
}

Assistant:

void DBOPL::WriteReg(int idx, int val) {
	Bit32u second_set = (Bit32u)idx&0x100;
	adlibreg[idx] = val;

	switch (idx&0xf0) {
	case ARC_CONTROL:
		// here we check for the second set registers, too:
		switch (idx) {
		case 0x02:	// timer1 counter
		case 0x03:	// timer2 counter
			break;
		case 0x04:
			// IRQ reset, timer mask/start
			if (val&0x80) {
				// clear IRQ bits in status register
				status &= ~0x60;
			} else {
				status = 0;
			}
			break;
#if defined(OPLTYPE_IS_OPL3)
		case 0x04|ARC_SECONDSET:
			// 4op enable/disable switches for each possible channel
			op[0].is_4op = (val&1)>0;
			op[3].is_4op_attached = op[0].is_4op;
			op[1].is_4op = (val&2)>0;
			op[4].is_4op_attached = op[1].is_4op;
			op[2].is_4op = (val&4)>0;
			op[5].is_4op_attached = op[2].is_4op;
			op[18].is_4op = (val&8)>0;
			op[21].is_4op_attached = op[18].is_4op;
			op[19].is_4op = (val&16)>0;
			op[22].is_4op_attached = op[19].is_4op;
			op[20].is_4op = (val&32)>0;
			op[23].is_4op_attached = op[20].is_4op;
			break;
		case 0x05|ARC_SECONDSET:
			break;
#endif
		case 0x08:
			// CSW, note select
			break;
		default:
			break;
		}
		break;
	case ARC_TVS_KSR_MUL:
	case ARC_TVS_KSR_MUL+0x10: {
		// tremolo/vibrato/sustain keeping enabled; key scale rate; frequency multiplication
		int num = (int)idx&7;
		Bitu base = (idx-ARC_TVS_KSR_MUL)&0xff;
		if ((num<6) && (base<22)) {
			Bitu modop = regbase2modop[second_set?(base+22):base];
			Bitu regbase = base+second_set;
			Bitu chanbase = second_set?(modop-18+ARC_SECONDSET):modop;

			// change tremolo/vibrato and sustain keeping of this operator
			op_type* op_ptr = &op[modop+((num<3) ? 0 : 9)];
			change_keepsustain(regbase,op_ptr);
			change_vibrato(regbase,op_ptr);

			// change frequency calculations of this operator as
			// key scale rate and frequency multiplicator can be changed
#if defined(OPLTYPE_IS_OPL3)
			if ((adlibreg[0x105]&1) && (op[modop].is_4op_attached)) {
				// operator uses frequency of channel
				change_frequency(chanbase-3,regbase,op_ptr);
			} else {
				change_frequency(chanbase,regbase,op_ptr);
			}
#else
			change_frequency(chanbase,base,op_ptr);
#endif
		}
		}
		break;
	case ARC_KSL_OUTLEV:
	case ARC_KSL_OUTLEV+0x10: {
		// key scale level; output rate
		int num = (int)idx&7;
		Bitu base = (idx-ARC_KSL_OUTLEV)&0xff;
		if ((num<6) && (base<22)) {
			Bitu modop = regbase2modop[second_set?(base+22):base];
			Bitu chanbase = second_set?(modop-18+ARC_SECONDSET):modop;

			// change frequency calculations of this operator as
			// key scale level and output rate can be changed
			op_type* op_ptr = &op[modop+((num<3) ? 0 : 9)];
#if defined(OPLTYPE_IS_OPL3)
			Bitu regbase = base+second_set;
			if ((adlibreg[0x105]&1) && (op[modop].is_4op_attached)) {
				// operator uses frequency of channel
				change_frequency(chanbase-3,regbase,op_ptr);
			} else {
				change_frequency(chanbase,regbase,op_ptr);
			}
#else
			change_frequency(chanbase,base,op_ptr);
#endif
		}
		}
		break;
	case ARC_ATTR_DECR:
	case ARC_ATTR_DECR+0x10: {
		// attack/decay rates
		int num = (int)idx&7;
		Bitu base = (idx-ARC_ATTR_DECR)&0xff;
		if ((num<6) && (base<22)) {
			Bitu regbase = base+second_set;

			// change attack rate and decay rate of this operator
			op_type* op_ptr = &op[regbase2op[second_set?(base+22):base]];
			change_attackrate(regbase,op_ptr);
			change_decayrate(regbase,op_ptr);
		}
		}
		break;
	case ARC_SUSL_RELR:
	case ARC_SUSL_RELR+0x10: {
		// sustain level; release rate
		int num = (int)idx&7;
		Bitu base = (idx-ARC_SUSL_RELR)&0xff;
		if ((num<6) && (base<22)) {
			Bitu regbase = base+second_set;

			// change sustain level and release rate of this operator
			op_type* op_ptr = &op[regbase2op[second_set?(base+22):base]];
			change_releaserate(regbase,op_ptr);
			change_sustainlevel(regbase,op_ptr);
		}
		}
		break;
	case ARC_FREQ_NUM: {
		// 0xa0-0xa8 low8 frequency
		Bitu base = (idx-ARC_FREQ_NUM)&0xff;
		if (base<9) {
			Bits opbase = second_set?(base+18):base;
#if defined(OPLTYPE_IS_OPL3)
			if ((adlibreg[0x105]&1) && op[opbase].is_4op_attached) break;
#endif
			// regbase of modulator:
			Bits modbase = modulatorbase[base]+second_set;

			Bitu chanbase = base+second_set;

			change_frequency(chanbase,modbase,&op[opbase]);
			change_frequency(chanbase,modbase+3,&op[opbase+9]);
#if defined(OPLTYPE_IS_OPL3)
			// for 4op channels all four operators are modified to the frequency of the channel
			if ((adlibreg[0x105]&1) && op[second_set?(base+18):base].is_4op) {
				change_frequency(chanbase,modbase+8,&op[opbase+3]);
				change_frequency(chanbase,modbase+3+8,&op[opbase+3+9]);
			}
#endif
		}
		}
		break;
	case ARC_KON_BNUM: {
		if (idx == ARC_PERC_MODE) {
#if defined(OPLTYPE_IS_OPL3)
			if (second_set) return;
#endif

			if ((val&0x30) == 0x30) {		// BassDrum active
				enable_operator(16,&op[6],OP_ACT_PERC);
				change_frequency(6,16,&op[6]);
				enable_operator(16+3,&op[6+9],OP_ACT_PERC);
				change_frequency(6,16+3,&op[6+9]);
			} else {
				disable_operator(&op[6],OP_ACT_PERC);
				disable_operator(&op[6+9],OP_ACT_PERC);
			}
			if ((val&0x28) == 0x28) {		// Snare active
				enable_operator(17+3,&op[16],OP_ACT_PERC);
				change_frequency(7,17+3,&op[16]);
			} else {
				disable_operator(&op[16],OP_ACT_PERC);
			}
			if ((val&0x24) == 0x24) {		// TomTom active
				enable_operator(18,&op[8],OP_ACT_PERC);
				change_frequency(8,18,&op[8]);
			} else {
				disable_operator(&op[8],OP_ACT_PERC);
			}
			if ((val&0x22) == 0x22) {		// Cymbal active
				enable_operator(18+3,&op[8+9],OP_ACT_PERC);
				change_frequency(8,18+3,&op[8+9]);
			} else {
				disable_operator(&op[8+9],OP_ACT_PERC);
			}
			if ((val&0x21) == 0x21) {		// Hihat active
				enable_operator(17,&op[7],OP_ACT_PERC);
				change_frequency(7,17,&op[7]);
			} else {
				disable_operator(&op[7],OP_ACT_PERC);
			}

			break;
		}
		// regular 0xb0-0xb8
		Bitu base = (idx-ARC_KON_BNUM)&0xff;
		if (base<9) {
			Bits opbase = second_set?(base+18):base;
#if defined(OPLTYPE_IS_OPL3)
			if ((adlibreg[0x105]&1) && op[opbase].is_4op_attached) break;
#endif
			// regbase of modulator:
			Bits modbase = modulatorbase[base]+second_set;

			if (val&32) {
				// operator switched on
				enable_operator(modbase,&op[opbase],OP_ACT_NORMAL);		// modulator (if 2op)
				enable_operator(modbase+3,&op[opbase+9],OP_ACT_NORMAL);	// carrier (if 2op)
#if defined(OPLTYPE_IS_OPL3)
				// for 4op channels all four operators are switched on
				if ((adlibreg[0x105]&1) && op[opbase].is_4op) {
					// turn on chan+3 operators as well
					enable_operator(modbase+8,&op[opbase+3],OP_ACT_NORMAL);
					enable_operator(modbase+3+8,&op[opbase+3+9],OP_ACT_NORMAL);
				}
#endif
			} else {
				// operator switched off
				disable_operator(&op[opbase],OP_ACT_NORMAL);
				disable_operator(&op[opbase+9],OP_ACT_NORMAL);
#if defined(OPLTYPE_IS_OPL3)
				// for 4op channels all four operators are switched off
				if ((adlibreg[0x105]&1) && op[opbase].is_4op) {
					// turn off chan+3 operators as well
					disable_operator(&op[opbase+3],OP_ACT_NORMAL);
					disable_operator(&op[opbase+3+9],OP_ACT_NORMAL);
				}
#endif
			}

			Bitu chanbase = base+second_set;

			// change frequency calculations of modulator and carrier (2op) as
			// the frequency of the channel has changed
			change_frequency(chanbase,modbase,&op[opbase]);
			change_frequency(chanbase,modbase+3,&op[opbase+9]);
#if defined(OPLTYPE_IS_OPL3)
			// for 4op channels all four operators are modified to the frequency of the channel
			if ((adlibreg[0x105]&1) && op[second_set?(base+18):base].is_4op) {
				// change frequency calculations of chan+3 operators as well
				change_frequency(chanbase,modbase+8,&op[opbase+3]);
				change_frequency(chanbase,modbase+3+8,&op[opbase+3+9]);
			}
#endif
		}
		}
		break;
	case ARC_FEEDBACK: {
		// 0xc0-0xc8 feedback/modulation type (AM/FM)
		Bitu base = (idx-ARC_FEEDBACK)&0xff;
		if (base<9) {
			Bits opbase = second_set?(base+18):base;
			Bitu chanbase = base+second_set;
			change_feedback(chanbase,&op[opbase]);
#if defined(OPLTYPE_IS_OPL3)
			// OPL3 panning
			if (!FullPan)
			{
				op[opbase].left_pan = (float)((val&0x10)>>4);
				op[opbase].right_pan = (float)((val&0x20)>>5);
			}
#endif
		}
		}
		break;
	case ARC_WAVE_SEL:
	case ARC_WAVE_SEL+0x10: {
		int num = (int)idx&7;
		Bitu base = (idx-ARC_WAVE_SEL)&0xff;
		if ((num<6) && (base<22)) {
#if defined(OPLTYPE_IS_OPL3)
			Bits wselbase = second_set?(base+22):base;	// for easier mapping onto wave_sel[]
			// change waveform
			if (adlibreg[0x105]&1) wave_sel[wselbase] = val&7;	// opl3 mode enabled, all waveforms accessible
			else wave_sel[wselbase] = val&3;
			op_type* op_ptr = &op[regbase2modop[wselbase]+((num<3) ? 0 : 9)];
			change_waveform(wselbase,op_ptr);
#else
			if (adlibreg[0x01]&0x20) {
				// wave selection enabled, change waveform
				wave_sel[base] = val&3;
				op_type* op_ptr = &op[regbase2modop[base]+((num<3) ? 0 : 9)];
				change_waveform(base,op_ptr);
			}
#endif
		}
		}
		break;
	default:
		break;
	}
}